

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O1

void __thiscall r_exec::_Mem::pack_hlp(_Mem *this,Code *hlp)

{
  _func_int *p_Var1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  int in_ECX;
  ulong uVar11;
  void *in_RDX;
  uint16_t i;
  void *in_R8;
  ulong uVar12;
  Atom t_atom;
  uint16_t extent_index;
  vector<r_code::Atom,_std::allocator<r_code::Atom>_> trailing_code;
  vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> references;
  P<r_code::Code> local_a8;
  int local_a0;
  ushort local_9c;
  byte local_99;
  _Mem *local_98;
  Atom local_8c [4];
  vector<r_code::Atom,_std::allocator<r_code::Atom>_> local_88;
  vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> local_68;
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  
  local_98 = this;
  iVar7 = clone(this,(__fn *)hlp,in_RDX,in_ECX,in_R8);
  local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
  super__Vector_impl_data._M_start = (Atom *)0x0;
  local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
  super__Vector_impl_data._M_finish = (Atom *)0x0;
  local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Atom *)0x0;
  (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
  uVar4 = r_code::Atom::asIndex();
  while( true ) {
    iVar8 = (*(hlp->super__Object)._vptr__Object[6])(hlp);
    p_Var1 = (hlp->super__Object)._vptr__Object[4];
    if ((ushort)iVar8 <= uVar4) break;
    iVar8 = (*p_Var1)(hlp,(ulong)uVar4);
    if (local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<r_code::Atom,std::allocator<r_code::Atom>>::_M_realloc_insert<r_code::Atom_const&>
                ((vector<r_code::Atom,std::allocator<r_code::Atom>> *)&local_88,
                 (iterator)
                 local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Atom *)CONCAT44(extraout_var_00,iVar8));
    }
    else {
      *(undefined4 *)
       local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
       super__Vector_impl_data._M_finish = *(undefined4 *)CONCAT44(extraout_var_00,iVar8);
      local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish + 4;
    }
    uVar4 = uVar4 + 1;
  }
  (*p_Var1)(hlp,5);
  iVar8 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)(ushort)iVar8);
  local_99 = r_code::Atom::getAtomCount();
  local_68.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(hlp->super__Object)._vptr__Object[4])(hlp,2);
  uVar9 = r_code::Atom::asIndex();
  uVar11 = (ulong)uVar9;
  local_38 = CONCAT44(extraout_var,iVar7);
  (*(hlp->super__Object)._vptr__Object[4])(hlp,uVar11 & 0xffff);
  bVar2 = r_code::Atom::getAtomCount();
  local_40 = (ulong)bVar2;
  local_a0 = uVar9 + bVar2 + 1;
  local_9c = (ushort)local_a0;
  uVar4 = (ushort)&local_a8;
  local_48 = uVar11;
  if (bVar2 != 0) {
    uVar5 = 0;
    do {
      iVar7 = (*(hlp->super__Object)._vptr__Object[9])(hlp,(ulong)uVar5);
      r_code::Atom::IPointer(uVar4);
      iVar10 = (*(hlp->super__Object)._vptr__Object[4])
                         (hlp,(ulong)(ushort)((short)uVar9 + 1 + uVar5));
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar10),(Atom *)&local_a8);
      r_code::Atom::~Atom((Atom *)&local_a8);
      pack_fact(local_98,(Code *)CONCAT44(extraout_var_01,iVar7),hlp,&local_9c,&local_68);
      uVar5 = uVar5 + 1;
    } while ((ushort)local_40 != uVar5);
  }
  local_98 = (_Mem *)(ulong)local_9c;
  local_a0 = (uint)local_9c - local_a0;
  if (local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar12 = 1;
    uVar11 = 0;
    do {
      local_a8.object._0_4_ =
           *(undefined4 *)
            (local_88.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
             super__Vector_impl_data._M_start + uVar11 * 4);
      cVar3 = r_code::Atom::getDescriptor();
      iVar7 = (int)uVar12;
      if (cVar3 == -0x7c) {
        r_code::Atom::asIndex();
        r_code::Atom::IPointer((ushort)local_8c);
        iVar10 = (*(hlp->super__Object)._vptr__Object[4])
                           (hlp,(ulong)(((int)local_98 + iVar7) - 1U & 0xffff));
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar10),local_8c);
LAB_00189867:
        r_code::Atom::~Atom(local_8c);
      }
      else {
        if (cVar3 == -0x73) {
          uVar5 = r_code::Atom::asAssignmentIndex();
          r_code::Atom::asIndex();
          r_code::Atom::AssignmentPointer((uchar)local_8c,uVar5 & 0xff);
          iVar10 = (*(hlp->super__Object)._vptr__Object[4])
                             (hlp,(ulong)(((int)local_98 + iVar7) - 1U & 0xffff));
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar10),local_8c);
          goto LAB_00189867;
        }
        iVar10 = (*(hlp->super__Object)._vptr__Object[4])
                           (hlp,(ulong)(((int)local_98 + iVar7) - 1U & 0xffff));
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar10),(Atom *)&local_a8);
      }
      r_code::Atom::~Atom((Atom *)&local_a8);
      uVar11 = uVar12 & 0xffff;
      uVar12 = (ulong)(iVar7 + 1);
    } while (uVar11 < (ulong)((long)local_88.
                                    super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_88.
                                    super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
  r_code::Atom::asIndex();
  r_code::Atom::IPointer(uVar4);
  iVar7 = (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar7),(Atom *)&local_a8);
  r_code::Atom::~Atom((Atom *)&local_a8);
  (*(hlp->super__Object)._vptr__Object[4])(hlp,4);
  r_code::Atom::asIndex();
  r_code::Atom::IPointer(uVar4);
  iVar7 = (*(hlp->super__Object)._vptr__Object[4])(hlp,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar7),(Atom *)&local_a8);
  r_code::Atom::~Atom((Atom *)&local_a8);
  (*(hlp->super__Object)._vptr__Object[4])(hlp,5);
  r_code::Atom::asIndex();
  r_code::Atom::IPointer(uVar4);
  iVar7 = (*(hlp->super__Object)._vptr__Object[4])(hlp,5);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar7),(Atom *)&local_a8);
  r_code::Atom::~Atom((Atom *)&local_a8);
  if (local_99 != 0) {
    uVar5 = (ushort)local_99;
    uVar9 = ((iVar8 + (int)local_98) - (int)local_48) - (uint)(ushort)local_40;
    do {
      (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)(uVar9 & 0xffff));
      uVar6 = r_code::Atom::asIndex();
      iVar7 = (*(hlp->super__Object)._vptr__Object[9])(hlp,(ulong)uVar6);
      local_a8.object = (_Object *)CONCAT44(extraout_var_09,iVar7);
      if (local_a8.object != (_Object *)0x0) {
        LOCK();
        ((local_a8.object)->refCount).super___atomic_base<long>._M_i =
             ((local_a8.object)->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
      }
      std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
      emplace_back<core::P<r_code::Code>>
                ((vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)&local_68,
                 &local_a8);
      if (local_a8.object != (_Object *)0x0) {
        LOCK();
        ((local_a8.object)->refCount).super___atomic_base<long>._M_i =
             ((local_a8.object)->refCount).super___atomic_base<long>._M_i + -1;
        UNLOCK();
        if (((local_a8.object)->refCount).super___atomic_base<long>._M_i < 1) {
          (*(local_a8.object)->_vptr__Object[1])();
        }
      }
      r_code::Atom::RPointer(uVar4);
      iVar7 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)(uVar9 & 0xffff));
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar7),(Atom *)&local_a8);
      r_code::Atom::~Atom((Atom *)&local_a8);
      uVar9 = uVar9 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  (*(hlp->super__Object)._vptr__Object[0xc])(hlp,&local_68);
  (*(hlp->super__Object)._vptr__Object[0x19])(hlp,local_38);
  std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::~vector(&local_68);
  std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::~vector(&local_88);
  return;
}

Assistant:

void _Mem::pack_hlp(Code *hlp) const   // produces a new object where a set of pattern objects is transformed into a packed set of pattern code.
{
    Code *unpacked_hlp = clone(hlp);
    std::vector<Atom> trailing_code; // copy of the original code (the latter will be overwritten by packed facts).
    uint16_t trailing_code_index = hlp->code(HLP_FWD_GUARDS).asIndex();

    for (uint16_t i = trailing_code_index; i < hlp->code_size(); ++i) {
        trailing_code.push_back(hlp->code(i));
    }

    uint16_t group_set_index = hlp->code(HLP_OUT_GRPS).asIndex();
    uint16_t group_count = hlp->code(group_set_index).getAtomCount();
    std::vector<P<Code> > references;
    uint16_t pattern_set_index = hlp->code(HLP_OBJS).asIndex();
    uint16_t pattern_count = hlp->code(pattern_set_index).getAtomCount();
    uint16_t insertion_point = pattern_set_index + pattern_count + 1; // point from where compacted code is to be inserted.
    uint16_t extent_index = insertion_point;

    for (uint16_t i = 0; i < pattern_count; ++i) {
        Code *pattern_object = hlp->get_reference(i);
        hlp->code(pattern_set_index + i + 1) = Atom::IPointer(extent_index);
        pack_fact(pattern_object, hlp, extent_index, &references);
    }

    uint16_t inserted_zone_length = extent_index - insertion_point;

    for (uint16_t i = 0; i < trailing_code.size(); ++i) { // shift the trailing code downward; adjust i-ptrs.
        Atom t_atom = trailing_code[i];

        switch (t_atom.getDescriptor()) {
        case Atom::I_PTR:
            hlp->code(i + extent_index) = Atom::IPointer(t_atom.asIndex() + inserted_zone_length);
            break;

        case Atom::ASSIGN_PTR:
            hlp->code(i + extent_index) = Atom::AssignmentPointer(t_atom.asAssignmentIndex(), t_atom.asIndex() + inserted_zone_length);
            break;

        default:
            hlp->code(i + extent_index) = t_atom;
            break;
        }
    }

    // adjust set indices.
    hlp->code(CST_FWD_GUARDS) = Atom::IPointer(hlp->code(HLP_FWD_GUARDS).asIndex() + inserted_zone_length);
    hlp->code(CST_BWD_GUARDS) = Atom::IPointer(hlp->code(HLP_BWD_GUARDS).asIndex() + inserted_zone_length);
    hlp->code(CST_OUT_GRPS) = Atom::IPointer(hlp->code(HLP_OUT_GRPS).asIndex() + inserted_zone_length);
    group_set_index += inserted_zone_length;

    for (uint16_t i = 1; i <= group_count; ++i) { // append the out_groups to the new references; adjust the exisitng r-ptrs.
        references.push_back(hlp->get_reference(hlp->code(group_set_index + i).asIndex()));
        hlp->code(group_set_index + i) = Atom::RPointer(references.size() - 1);
    }

    hlp->set_references(references);
    hlp->add_reference(unpacked_hlp); // hidden reference.
}